

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall QDockAreaLayout::keepSize(QDockAreaLayout *this,QDockWidget *w)

{
  long lVar1;
  bool bVar2;
  QDockAreaLayoutItem *pQVar3;
  QList<int> *in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayoutItem *item;
  QList<int> path;
  QDockAreaLayout *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QDockAreaLayout *)&DAT_aaaaaaaaaaaaaaaa;
  indexOf((QDockAreaLayout *)&DAT_aaaaaaaaaaaaaaaa,(QWidget *)&DAT_aaaaaaaaaaaaaaaa);
  bVar2 = QList<int>::isEmpty((QList<int> *)0x57ce16);
  if ((!bVar2) && (pQVar3 = QDockAreaLayout::item(this_00,in_RDI), pQVar3->size != -1)) {
    pQVar3->flags = pQVar3->flags | 2;
  }
  QList<int>::~QList((QList<int> *)0x57ce73);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockAreaLayout::keepSize(QDockWidget *w)
{
    QList<int> path = indexOf(w);
    if (path.isEmpty())
        return;
    QDockAreaLayoutItem &item = this->item(path);
    if (item.size != -1)
        item.flags |= QDockAreaLayoutItem::KeepSize;
}